

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_dr_wav_uninit(ma_dr_wav *pWav)

{
  ma_dr_wav_container mVar1;
  ma_dr_wav_seek_proc p_Var2;
  ma_bool32 mVar3;
  ma_uint32 mVar4;
  ma_uint64 in_RAX;
  uint uVar5;
  ma_result mVar6;
  void *pvVar7;
  size_t sStack_20;
  ma_uint64 paddingData;
  
  if (pWav == (ma_dr_wav *)0x0) {
    return MA_INVALID_ARGS;
  }
  paddingData = in_RAX;
  if (pWav->onWrite == (ma_dr_wav_write_proc)0x0) {
    ma_dr_wav__free_from_callbacks(pWav->pMetadata,&pWav->allocationCallbacks);
  }
  else {
    uVar5 = 7;
    if (pWav->container == ma_dr_wav_container_rf64) {
      uVar5 = 1;
    }
    if (pWav->container == ma_dr_wav_container_riff) {
      uVar5 = 1;
    }
    uVar5 = uVar5 & (uint)pWav->dataChunkDataSize;
    if (uVar5 != 0) {
      paddingData = 0;
      (*pWav->onWrite)(pWav->pUserData,&paddingData,(size_t)uVar5);
    }
    p_Var2 = pWav->onSeek;
    if ((p_Var2 != (ma_dr_wav_seek_proc)0x0) && (pWav->isSequentialWrite == 0)) {
      mVar1 = pWav->container;
      if (mVar1 == ma_dr_wav_container_rf64) {
        mVar3 = (*p_Var2)(pWav->pUserData,0x14,ma_dr_wav_seek_origin_start);
        if (mVar3 != 0) {
          paddingData = ma_dr_wav__riff_chunk_size_rf64
                                  (pWav->dataChunkDataSize,pWav->pMetadata,pWav->metadataCount);
          (*pWav->onWrite)(pWav->pUserData,&paddingData,8);
        }
        mVar3 = (*pWav->onSeek)(pWav->pUserData,0x1c,ma_dr_wav_seek_origin_start);
        if (mVar3 != 0) {
          paddingData = pWav->dataChunkDataSize;
LAB_0014924b:
          pvVar7 = pWav->pUserData;
          sStack_20 = 8;
LAB_00149257:
          (*pWav->onWrite)(pvVar7,&paddingData,sStack_20);
        }
      }
      else if (mVar1 == ma_dr_wav_container_w64) {
        mVar3 = (*p_Var2)(pWav->pUserData,0x10,ma_dr_wav_seek_origin_start);
        if (mVar3 != 0) {
          paddingData = pWav->dataChunkDataSize + (ulong)((uint)pWav->dataChunkDataSize & 7) + 0x68;
          (*pWav->onWrite)(pWav->pUserData,&paddingData,8);
        }
        mVar3 = (*pWav->onSeek)(pWav->pUserData,(int)pWav->dataChunkDataPos + -8,
                                ma_dr_wav_seek_origin_start);
        if (mVar3 != 0) {
          paddingData = pWav->dataChunkDataSize + 0x18;
          goto LAB_0014924b;
        }
      }
      else if (mVar1 == ma_dr_wav_container_riff) {
        mVar3 = (*p_Var2)(pWav->pUserData,4,ma_dr_wav_seek_origin_start);
        if (mVar3 != 0) {
          mVar4 = ma_dr_wav__riff_chunk_size_riff
                            (pWav->dataChunkDataSize,pWav->pMetadata,pWav->metadataCount);
          paddingData = CONCAT44(paddingData._4_4_,mVar4);
          (*pWav->onWrite)(pWav->pUserData,&paddingData,4);
        }
        mVar3 = (*pWav->onSeek)(pWav->pUserData,(int)pWav->dataChunkDataPos + -4,
                                ma_dr_wav_seek_origin_start);
        if (mVar3 != 0) {
          paddingData = CONCAT44(paddingData._4_4_,
                                 -(uint)(pWav->dataChunkDataSize >> 0x20 != 0) |
                                 (uint)pWav->dataChunkDataSize);
          pvVar7 = pWav->pUserData;
          sStack_20 = 4;
          goto LAB_00149257;
        }
      }
    }
    if (pWav->isSequentialWrite != 0) {
      mVar6 = MA_INVALID_FILE;
      if (pWav->dataChunkDataSize == pWav->dataChunkDataSizeTargetWrite) {
        mVar6 = MA_SUCCESS;
      }
      goto LAB_0014927e;
    }
  }
  mVar6 = MA_SUCCESS;
LAB_0014927e:
  if ((pWav->onRead == ma_dr_wav__on_read_stdio) || (pWav->onWrite == ma_dr_wav__on_write_stdio)) {
    fclose((FILE *)pWav->pUserData);
  }
  return mVar6;
}

Assistant:

MA_API ma_result ma_dr_wav_uninit(ma_dr_wav* pWav)
{
    ma_result result = MA_SUCCESS;
    if (pWav == NULL) {
        return MA_INVALID_ARGS;
    }
    if (pWav->onWrite != NULL) {
        ma_uint32 paddingSize = 0;
        if (pWav->container == ma_dr_wav_container_riff || pWav->container == ma_dr_wav_container_rf64) {
            paddingSize = ma_dr_wav__chunk_padding_size_riff(pWav->dataChunkDataSize);
        } else {
            paddingSize = ma_dr_wav__chunk_padding_size_w64(pWav->dataChunkDataSize);
        }
        if (paddingSize > 0) {
            ma_uint64 paddingData = 0;
            ma_dr_wav__write(pWav, &paddingData, paddingSize);
        }
        if (pWav->onSeek && !pWav->isSequentialWrite) {
            if (pWav->container == ma_dr_wav_container_riff) {
                if (pWav->onSeek(pWav->pUserData, 4, ma_dr_wav_seek_origin_start)) {
                    ma_uint32 riffChunkSize = ma_dr_wav__riff_chunk_size_riff(pWav->dataChunkDataSize, pWav->pMetadata, pWav->metadataCount);
                    ma_dr_wav__write_u32ne_to_le(pWav, riffChunkSize);
                }
                if (pWav->onSeek(pWav->pUserData, (int)pWav->dataChunkDataPos - 4, ma_dr_wav_seek_origin_start)) {
                    ma_uint32 dataChunkSize = ma_dr_wav__data_chunk_size_riff(pWav->dataChunkDataSize);
                    ma_dr_wav__write_u32ne_to_le(pWav, dataChunkSize);
                }
            } else if (pWav->container == ma_dr_wav_container_w64) {
                if (pWav->onSeek(pWav->pUserData, 16, ma_dr_wav_seek_origin_start)) {
                    ma_uint64 riffChunkSize = ma_dr_wav__riff_chunk_size_w64(pWav->dataChunkDataSize);
                    ma_dr_wav__write_u64ne_to_le(pWav, riffChunkSize);
                }
                if (pWav->onSeek(pWav->pUserData, (int)pWav->dataChunkDataPos - 8, ma_dr_wav_seek_origin_start)) {
                    ma_uint64 dataChunkSize = ma_dr_wav__data_chunk_size_w64(pWav->dataChunkDataSize);
                    ma_dr_wav__write_u64ne_to_le(pWav, dataChunkSize);
                }
            } else if (pWav->container == ma_dr_wav_container_rf64) {
                int ds64BodyPos = 12 + 8;
                if (pWav->onSeek(pWav->pUserData, ds64BodyPos + 0, ma_dr_wav_seek_origin_start)) {
                    ma_uint64 riffChunkSize = ma_dr_wav__riff_chunk_size_rf64(pWav->dataChunkDataSize, pWav->pMetadata, pWav->metadataCount);
                    ma_dr_wav__write_u64ne_to_le(pWav, riffChunkSize);
                }
                if (pWav->onSeek(pWav->pUserData, ds64BodyPos + 8, ma_dr_wav_seek_origin_start)) {
                    ma_uint64 dataChunkSize = ma_dr_wav__data_chunk_size_rf64(pWav->dataChunkDataSize);
                    ma_dr_wav__write_u64ne_to_le(pWav, dataChunkSize);
                }
            }
        }
        if (pWav->isSequentialWrite) {
            if (pWav->dataChunkDataSize != pWav->dataChunkDataSizeTargetWrite) {
                result = MA_INVALID_FILE;
            }
        }
    } else {
        ma_dr_wav_free(pWav->pMetadata, &pWav->allocationCallbacks);
    }
#ifndef MA_DR_WAV_NO_STDIO
    if (pWav->onRead == ma_dr_wav__on_read_stdio || pWav->onWrite == ma_dr_wav__on_write_stdio) {
        fclose((FILE*)pWav->pUserData);
    }
#endif
    return result;
}